

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_fill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  int iVar2;
  JSValueUnion JVar3;
  int64_t idx;
  JSValue obj;
  JSValue JVar4;
  JSValue val;
  int64_t end;
  int64_t len;
  int64_t local_50;
  JSValueUnion local_48;
  long local_40;
  int64_t local_38;
  
  obj = JS_ToObject(ctx,this_val);
  JVar3 = obj.u;
  iVar2 = js_get_length64(ctx,&local_38,obj);
  idx = local_50;
  if (((iVar2 == 0) &&
      (((local_50 = 0, argc < 2 || ((int)argv[1].tag == 3)) ||
       (JVar4.tag = argv[1].tag, JVar4.u.ptr = argv[1].u.ptr,
       iVar2 = JS_ToInt64Clamp(ctx,&local_50,JVar4,0,local_38,local_38), idx = local_50, iVar2 == 0)
       ))) && (((local_40 = local_38, argc < 3 || ((int)argv[2].tag == 3)) ||
               (val.tag = argv[2].tag, val.u.ptr = argv[2].u.ptr,
               iVar2 = JS_ToInt64Clamp(ctx,&local_40,val,0,local_38,local_38), idx = local_50,
               iVar2 == 0)))) {
    lVar1 = local_40;
    idx = local_50;
    if (local_50 < local_40) {
      do {
        local_48 = (JSValueUnion)(argv->u).ptr;
        JVar4 = *argv;
        if (0xfffffff4 < (uint)argv->tag) {
          *(int *)local_48.ptr = *local_48.ptr + 1;
        }
        iVar2 = JS_SetPropertyInt64(ctx,obj,idx,JVar4);
        if (iVar2 < 0) goto LAB_00165bd3;
        idx = idx + 1;
      } while (lVar1 != idx);
    }
  }
  else {
LAB_00165bd3:
    local_50 = idx;
    if ((0xfffffff4 < (uint)obj.tag) &&
       (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
      local_48 = JVar3;
      __JS_FreeValueRT(ctx->rt,obj);
    }
    obj = (JSValue)(ZEXT816(6) << 0x40);
  }
  return obj;
}

Assistant:

static JSValue js_array_fill(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSValue obj;
    int64_t len, start, end;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    start = 0;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        if (JS_ToInt64Clamp(ctx, &start, argv[1], 0, len, len))
            goto exception;
    }

    end = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt64Clamp(ctx, &end, argv[2], 0, len, len))
            goto exception;
    }

    /* XXX: should special case fast arrays */
    while (start < end) {
        if (JS_SetPropertyInt64(ctx, obj, start,
                                JS_DupValue(ctx, argv[0])) < 0)
            goto exception;
        start++;
    }
    return obj;

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}